

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestHandlerCommand::InitialPass
          (cmCTestHandlerCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  cmMakefile *pcVar3;
  cmCTest *pcVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  long *plVar10;
  ostream *poVar11;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  uint uVar12;
  pointer pbVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  string current_dir;
  ostringstream e;
  undefined1 auStack_218 [8];
  string local_210;
  allocator local_1e9;
  string local_1e8;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  long *local_50 [2];
  long local_40 [2];
  undefined4 extraout_var;
  
  this_00 = &this->Values;
  ppcVar2 = (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar2) {
    (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar2;
  }
  local_1c8._0_8_ = (char *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (this_00,this->Last,(value_type *)local_1c8);
  this->ArgumentDoing = 0;
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar13) {
    uVar12 = 1;
    uVar16 = 0;
    do {
      iVar7 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xd])
                        (this,pbVar13 + uVar16);
      if (((char)iVar7 == '\0') &&
         (iVar7 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xe])
                            (this,(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16),
         (char)iVar7 == '\0')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"called with unknown argument \"",0x1e);
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c8,pbVar13[uVar16]._M_dataplus._M_p,
                             pbVar13[uVar16]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".",2);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p == &local_210.field_2) goto LAB_002e640a;
        goto LAB_002e63fd;
      }
      if (this->ArgumentDoing == 1) goto LAB_002e6428;
      uVar16 = (ulong)uVar12;
      pbVar13 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar12 + 1;
    } while (uVar16 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 >> 5
                             ));
  }
  pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
  pcVar5 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_CONFIGURATION_TYPE","")
  ;
  pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1c8);
  if ((char *)local_1c8._0_8_ != pcVar5) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if (pcVar8 != (char *)0x0) {
    cmCTest::SetConfigType((this->super_cmCTestCommand).CTest,pcVar8);
  }
  pcVar8 = (this_00->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
           super__Vector_impl_data._M_start[2];
  if (pcVar8 == (char *)0x0) {
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_1c8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_BINARY_DIRECTORY","")
    ;
    pcVar8 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_1c8);
    if ((char *)local_1c8._0_8_ != pcVar5) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"CTEST_BINARY_DIRECTORY not set",0x1e);
      std::ios::widen((char)(ostringstream *)local_1c8 +
                      (char)*(undefined8 *)(local_1c8._0_8_ + -0x18));
      std::ostream::put((char)local_1c8);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x5d,local_210._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
    }
    else {
      pcVar4 = (this->super_cmCTestCommand).CTest;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      sVar9 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,pcVar8,pcVar8 + sVar9);
      cmsys::SystemTools::CollapseFullPath((string *)local_1c8,&local_210);
      cmCTest::SetCTestConfiguration(pcVar4,"BuildDirectory",(char *)local_1c8._0_8_,this->Quiet);
      if ((char *)local_1c8._0_8_ != pcVar5) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_002e5d4d;
    }
  }
  else {
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::string::string((string *)&local_210,pcVar8,(allocator *)&local_1e8);
    cmsys::SystemTools::CollapseFullPath((string *)local_1c8,&local_210);
    cmCTest::SetCTestConfiguration(pcVar4,"BuildDirectory",(char *)local_1c8._0_8_,this->Quiet);
    if ((char *)local_1c8._0_8_ != pcVar5) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
LAB_002e5d4d:
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this_00->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
      super__Vector_impl_data._M_start[3] == (char *)0x0) {
    pcVar4 = (this->super_cmCTestCommand).CTest;
    pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"CTEST_SOURCE_DIRECTORY","");
    pcVar8 = cmMakefile::GetSafeDefinition(pcVar3,&local_1e8);
    std::__cxx11::string::string((string *)&local_210,pcVar8,(allocator *)local_50);
    cmsys::SystemTools::CollapseFullPath((string *)local_1c8,&local_210);
    cmCTest::SetCTestConfiguration(pcVar4,"SourceDirectory",(char *)local_1c8._0_8_,this->Quiet);
    if ((char *)local_1c8._0_8_ != pcVar5) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    uVar14 = local_1e8.field_2._M_allocated_capacity;
    _Var15._M_p = local_1e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) goto LAB_002e60cf;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Set source directory to: ",0x19);
    pcVar8 = (this_00->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_start[3];
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)(auStack_218 + *(long *)(local_1c8._0_8_ + -0x18)) + 0x50);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar8,sVar9);
    }
    std::ios::widen((char)(ostringstream *)local_1c8 +
                    (char)*(undefined8 *)(local_1c8._0_8_ + -0x18));
    std::ostream::put((char)local_1c8);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                 ,99,local_210._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::string::string
              ((string *)&local_210,
               (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_start[3],(allocator *)&local_1e8);
    cmsys::SystemTools::CollapseFullPath((string *)local_1c8,&local_210);
    cmCTest::SetCTestConfiguration(pcVar4,"SourceDirectory",(char *)local_1c8._0_8_,this->Quiet);
    if ((char *)local_1c8._0_8_ != pcVar5) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    uVar14 = local_210.field_2._M_allocated_capacity;
    _Var15._M_p = local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p == &local_210.field_2) goto LAB_002e60cf;
  }
  operator_delete(_Var15._M_p,uVar14 + 1);
LAB_002e60cf:
  pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
  local_1c8._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_CHANGE_ID","");
  pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1c8);
  if ((char *)local_1c8._0_8_ != pcVar5) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if (pcVar8 != (char *)0x0) {
    cmCTest::SetCTestConfiguration((this->super_cmCTestCommand).CTest,"ChangeId",pcVar8,this->Quiet)
    ;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Initialize handler",0x12)
  ;
  std::ios::widen((char)(ostringstream *)local_1c8 + (char)*(undefined8 *)(local_1c8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1c8);
  std::ostream::flush();
  pcVar4 = (this->super_cmCTestCommand).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
               ,0x76,local_210._M_dataplus._M_p,false);
  paVar1 = &local_210.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  iVar7 = (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xc])(this);
  plVar10 = (long *)CONCAT44(extraout_var,iVar7);
  if (plVar10 == (long *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Cannot instantiate test handler ",0x20);
    (*(this->super_cmCTestCommand).super_cmCommand.super_cmObject._vptr_cmObject[0xb])
              (&local_210,this);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,local_210._M_dataplus._M_p,local_210._M_string_length)
    ;
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                 ,0x7c,local_210._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
LAB_002e63fd:
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
LAB_002e640a:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
LAB_002e6428:
    bVar6 = false;
  }
  else {
    *(bool *)(plVar10 + 1) = this->AppendXML;
    (**(code **)(*plVar10 + 0x20))(plVar10,(this->super_cmCTestCommand).super_cmCommand.Makefile);
    pcVar8 = (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[4];
    collapse = extraout_DL;
    if (pcVar8 != (char *)0x0) {
      pcVar4 = (this->super_cmCTestCommand).CTest;
      if ((pcVar4->DropSiteCDash == false) && (pcVar4->DartVersion < 2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,
                   "Dart before version 2.0 does not support collecting submissions.",0x40);
        std::ios::widen((char)(ostringstream *)local_1c8 +
                        (char)*(undefined8 *)(local_1c8._0_8_ + -0x18));
        std::ostream::put((char)local_1c8);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,
                   "Please upgrade the server to Dart 2 or higher, or do not use SUBMIT_INDEX.",0x4a
                  );
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                     ,0x8b,local_210._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        collapse = extraout_DL_00;
      }
      else {
        iVar7 = atoi(pcVar8);
        *(int *)(plVar10 + 0x12) = iVar7;
        collapse = extraout_DL_01;
      }
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_210,(SystemTools *)0x1,(bool)collapse);
    pcVar4 = (this->super_cmCTestCommand).CTest;
    paVar1 = &local_1e8.field_2;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"BuildDirectory","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_1e8);
    cmsys::SystemTools::ChangeDirectory((string *)local_1c8);
    if ((char *)local_1c8._0_8_ != pcVar5) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    iVar7 = (**(code **)(*plVar10 + 0x28))(plVar10);
    pcVar5 = (this_00->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_start[1];
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::ostream::operator<<(local_1c8,iVar7);
      pcVar3 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::__cxx11::string::string
                ((string *)&local_1e8,
                 (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[1],&local_1e9);
      std::__cxx11::stringbuf::str();
      cmMakefile::AddDefinition(pcVar3,&local_1e8,(char *)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
    }
    cmsys::SystemTools::ChangeDirectory(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool cmCTestHandlerCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // Allocate space for argument values.
  this->Values.clear();
  this->Values.resize(this->Last, 0);

  // Process input arguments.
  this->ArgumentDoing = ArgumentDoingNone;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    // Check this argument.
    if(!this->CheckArgumentKeyword(args[i]) &&
       !this->CheckArgumentValue(args[i]))
      {
      std::ostringstream e;
      e << "called with unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }

    // Quit if an argument is invalid.
    if(this->ArgumentDoing == ArgumentDoingError)
      {
      return false;
      }
    }

  // Set the config type of this ctest to the current value of the
  // CTEST_CONFIGURATION_TYPE script variable if it is defined.
  // The current script value trumps the -C argument on the command
  // line.
  const char* ctestConfigType =
    this->Makefile->GetDefinition("CTEST_CONFIGURATION_TYPE");
  if (ctestConfigType)
    {
    this->CTest->SetConfigType(ctestConfigType);
    }

  if ( this->Values[ct_BUILD] )
    {
    this->CTest->SetCTestConfiguration("BuildDirectory",
      cmSystemTools::CollapseFullPath(
        this->Values[ct_BUILD]).c_str(), this->Quiet);
    }
  else
    {
    const char* bdir =
      this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");
    if(bdir)
      {
      this->
        CTest->SetCTestConfiguration("BuildDirectory",
          cmSystemTools::CollapseFullPath(bdir).c_str(), this->Quiet);
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "CTEST_BINARY_DIRECTORY not set" << std::endl;);
      }
    }
  if ( this->Values[ct_SOURCE] )
    {
    cmCTestLog(this->CTest, DEBUG,
      "Set source directory to: " << this->Values[ct_SOURCE] << std::endl);
    this->CTest->SetCTestConfiguration("SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Values[ct_SOURCE]).c_str(), this->Quiet);
    }
  else
    {
    this->CTest->SetCTestConfiguration("SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY")).c_str(),
      this->Quiet);
    }

  if(const char* changeId =
     this->Makefile->GetDefinition("CTEST_CHANGE_ID"))
    {
    this->CTest->SetCTestConfiguration("ChangeId", changeId, this->Quiet);
    }

  cmCTestLog(this->CTest, DEBUG, "Initialize handler" << std::endl;);
  cmCTestGenericHandler* handler = this->InitializeHandler();
  if ( !handler )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot instantiate test handler " << this->GetName()
               << std::endl);
    return false;
    }

  handler->SetAppendXML(this->AppendXML);

  handler->PopulateCustomVectors(this->Makefile);
  if ( this->Values[ct_SUBMIT_INDEX] )
    {
    if(!this->CTest->GetDropSiteCDash() && this->CTest->GetDartVersion() <= 1)
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Dart before version 2.0 does not support collecting submissions."
        << std::endl
        << "Please upgrade the server to Dart 2 or higher, or do not use "
        "SUBMIT_INDEX." << std::endl);
      }
    else
      {
      handler->SetSubmitIndex(atoi(this->Values[ct_SUBMIT_INDEX]));
      }
    }
  std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(
    this->CTest->GetCTestConfiguration("BuildDirectory"));
  int res = handler->ProcessHandler();
  if ( this->Values[ct_RETURN_VALUE] && *this->Values[ct_RETURN_VALUE])
    {
    std::ostringstream str;
    str << res;
    this->Makefile->AddDefinition(
      this->Values[ct_RETURN_VALUE], str.str().c_str());
    }
  cmSystemTools::ChangeDirectory(current_dir);
  return true;
}